

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O0

void ft_lzwstate_init(FT_LzwState state,FT_Stream source)

{
  FT_Stream source_local;
  FT_LzwState state_local;
  
  memset(state,0,0xd8);
  state->source = source;
  state->memory = source->memory;
  state->prefix = (FT_UShort *)0x0;
  state->suffix = (FT_Byte *)0x0;
  state->prefix_size = 0;
  state->stack = state->stack_0;
  state->stack_size = 0x40;
  ft_lzwstate_reset(state);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ft_lzwstate_init( FT_LzwState  state,
                    FT_Stream    source )
  {
    FT_ZERO( state );

    state->source = source;
    state->memory = source->memory;

    state->prefix      = NULL;
    state->suffix      = NULL;
    state->prefix_size = 0;

    state->stack      = state->stack_0;
    state->stack_size = sizeof ( state->stack_0 );

    ft_lzwstate_reset( state );
  }